

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ClassPropertyDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ClassPropertyDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::syntax::TokenList&,slang::syntax::MemberSyntax&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          TokenList *args_1,MemberSyntax *args_2)

{
  ClassPropertyDeclarationSyntax *pCVar1;
  MemberSyntax *in_RDX;
  TokenList *in_RSI;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_RDI;
  ClassPropertyDeclarationSyntax *unaff_retaddr;
  
  pCVar1 = (ClassPropertyDeclarationSyntax *)
           allocate((BumpAllocator *)in_RDI,(size_t)in_RSI,(size_t)in_RDX);
  slang::syntax::ClassPropertyDeclarationSyntax::ClassPropertyDeclarationSyntax
            (unaff_retaddr,in_RDI,in_RSI,in_RDX);
  return pCVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }